

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deBlockBuffer.hpp
# Opt level: O2

int __thiscall
de::BlockBuffer<unsigned_char>::writeToCurrentBlock
          (BlockBuffer<unsigned_char> *this,int numElements,uchar *elements,bool blocking)

{
  int iVar1;
  int iVar2;
  uchar *puVar3;
  deBool dVar4;
  int iVar5;
  undefined8 *puVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  
  iVar5 = this->m_writePos;
  if (iVar5 == 0) {
    if (blocking) {
      deSemaphore_decrement(this->m_empty);
    }
    else {
      dVar4 = deSemaphore_tryDecrement(this->m_empty);
      if (dVar4 == 0) {
        return 0;
      }
    }
    if (this->m_canceled != 0) {
      deSemaphore_increment(this->m_empty);
      Mutex::unlock(&this->m_writeLock);
      puVar6 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar6 = &PTR__exception_00282bc8;
      __cxa_throw(puVar6,&BufferCanceledException::typeinfo,std::exception::~exception);
    }
    iVar5 = this->m_writePos;
  }
  iVar1 = this->m_blockSize;
  iVar2 = this->m_writeBlock;
  puVar3 = this->m_elements;
  uVar9 = iVar1 - iVar5;
  if (numElements < (int)uVar9) {
    uVar9 = numElements;
  }
  uVar7 = 0;
  uVar8 = 0;
  if (0 < (int)uVar9) {
    uVar8 = (ulong)uVar9;
  }
  for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
    puVar3[(long)(this->m_writePos + (int)uVar7) + (long)(iVar2 * iVar1)] = elements[uVar7];
  }
  iVar5 = this->m_writePos + uVar9;
  this->m_writePos = iVar5;
  if (iVar5 == this->m_blockSize) {
    flushWriteBlock(this);
  }
  return uVar9;
}

Assistant:

int BlockBuffer<T>::writeToCurrentBlock (int numElements, const T* elements, bool blocking)
{
	DE_ASSERT(numElements > 0 && elements != DE_NULL);

	if (m_writePos == 0)
	{
		/* Write thread doesn't own current block - need to acquire. */
		if (blocking)
			deSemaphore_decrement(m_empty);
		else
		{
			if (!deSemaphore_tryDecrement(m_empty))
				return 0;
		}

		/* Check for canceled bit. */
		if (m_canceled)
		{
			// \todo [2012-07-06 pyry] A bit hackish to assume that write lock is not freed if exception is thrown out here.
			deSemaphore_increment(m_empty);
			m_writeLock.unlock();
			throw CanceledException();
		}
	}

	/* Write thread owns current block. */
	T*		block			= m_elements + m_writeBlock*m_blockSize;
	int		numToWrite		= de::min(numElements, m_blockSize-m_writePos);

	DE_ASSERT(numToWrite > 0);

	for (int ndx = 0; ndx < numToWrite; ndx++)
		block[m_writePos+ndx] = elements[ndx];

	m_writePos += numToWrite;

	if (m_writePos == m_blockSize)
		flushWriteBlock(); /* Flush current write block. */

	return numToWrite;
}